

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

bool QtPrivate::QLessThanOperatorForType<QList<unsigned_int>,_true>::lessThan
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  
  puVar1 = *(uint **)((long)b + 8);
  uVar2 = *(ulong *)((long)b + 0x10);
  uVar3 = *(ulong *)((long)a + 0x10);
  if ((long)uVar2 < (long)*(ulong *)((long)a + 0x10)) {
    uVar3 = uVar2;
  }
  puVar4 = puVar1;
  if ((uVar3 & 0x3fffffffffffffff) != 0) {
    puVar5 = *(uint **)((long)a + 8);
    puVar6 = puVar5 + uVar3;
    do {
      if (*puVar4 != *puVar5) {
        return *puVar5 < *puVar4;
      }
      puVar5 = puVar5 + 1;
      puVar4 = puVar4 + 1;
    } while (puVar5 != puVar6);
  }
  return puVar4 != puVar1 + uVar2;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }